

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O3

int ompt_get_partition_place_nums(int place_nums_size,int *place_nums)

{
  uint uVar1;
  uint uVar2;
  kmp_info_t *pkVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  long lVar15;
  
  iVar7 = 0;
  iVar11 = 0;
  if ((((ompt_enabled._0_1_ & 1) != 0) &&
      (iVar6 = __kmp_get_global_thread_id(), iVar11 = iVar7, -1 < iVar6)) &&
     (__kmp_affin_mask_size != 0)) {
    iVar7 = __kmp_get_global_thread_id_reg();
    auVar5 = _DAT_0017d420;
    pkVar3 = __kmp_threads[iVar7];
    if (pkVar3 != (kmp_info_t *)0x0) {
      uVar1 = (pkVar3->th).th_first_place;
      uVar2 = (pkVar3->th).th_last_place;
      if (-1 < (int)(uVar1 | uVar2)) {
        uVar8 = uVar2;
        if (uVar1 < uVar2) {
          uVar8 = uVar1;
        }
        uVar4 = uVar2;
        if (uVar2 < uVar1) {
          uVar4 = uVar1;
        }
        lVar9 = (ulong)uVar1 - (ulong)uVar2;
        lVar12 = -lVar9;
        if (0 < lVar9) {
          lVar12 = lVar9;
        }
        if ((int)lVar12 <= place_nums_size) {
          uVar10 = (ulong)((uVar4 - uVar8) + 1);
          lVar9 = uVar10 - 1;
          auVar13._8_4_ = (int)lVar9;
          auVar13._0_8_ = lVar9;
          auVar13._12_4_ = (int)((ulong)lVar9 >> 0x20);
          lVar9 = 3;
          auVar13 = auVar13 ^ _DAT_0017d420;
          auVar14 = _DAT_0017d410;
          auVar16 = _DAT_00178000;
          do {
            auVar17 = auVar16 ^ auVar5;
            iVar11 = auVar13._4_4_;
            if ((bool)(~(auVar17._4_4_ == iVar11 && auVar13._0_4_ < auVar17._0_4_ ||
                        iVar11 < auVar17._4_4_) & 1)) {
              place_nums[lVar9 + -3] = uVar8;
            }
            if ((auVar17._12_4_ != auVar13._12_4_ || auVar17._8_4_ <= auVar13._8_4_) &&
                auVar17._12_4_ <= auVar13._12_4_) {
              place_nums[lVar9 + -2] = uVar8 + 1;
            }
            auVar17 = auVar14 ^ auVar5;
            iVar7 = auVar17._4_4_;
            if (iVar7 <= iVar11 && (iVar7 != iVar11 || auVar17._0_4_ <= auVar13._0_4_)) {
              place_nums[lVar9 + -1] = uVar8 + 2;
              place_nums[lVar9] = uVar8 + 3;
            }
            lVar15 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 4;
            auVar16._8_8_ = lVar15 + 4;
            lVar15 = auVar14._8_8_;
            auVar14._0_8_ = auVar14._0_8_ + 4;
            auVar14._8_8_ = lVar15 + 4;
            lVar15 = lVar9 - (uVar10 + 3 & 0xfffffffffffffffc);
            lVar9 = lVar9 + 4;
            uVar8 = uVar8 + 4;
          } while (lVar15 != -1);
        }
        iVar11 = (int)lVar12 + 1;
      }
    }
  }
  return iVar11;
}

Assistant:

OMPT_API_ROUTINE int ompt_get_partition_place_nums(int place_nums_size,
                                                   int *place_nums) {
// copied from kmp_ftn_entry.h (but modified)
#if !KMP_AFFINITY_SUPPORTED
  return 0;
#else
  if (!ompt_enabled.enabled || __kmp_get_gtid() < 0)
    return 0;

  int i, gtid, place_num, first_place, last_place, start, end;
  kmp_info_t *thread;
  if (!KMP_AFFINITY_CAPABLE())
    return 0;
  gtid = __kmp_entry_gtid();
  thread = __kmp_thread_from_gtid(gtid);
  if (thread == NULL)
    return 0;
  first_place = thread->th.th_first_place;
  last_place = thread->th.th_last_place;
  if (first_place < 0 || last_place < 0)
    return 0;
  if (first_place <= last_place) {
    start = first_place;
    end = last_place;
  } else {
    start = last_place;
    end = first_place;
  }
  if (end - start <= place_nums_size)
    for (i = 0, place_num = start; place_num <= end; ++place_num, ++i) {
      place_nums[i] = place_num;
    }
  return end - start + 1;
#endif
}